

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

void CombinationKeygenRecurse<unsigned_int,block32>
               (block32 *key,int len,int maxlen,block32 *blocks,int blockcount,pfHash hash,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes)

{
  char *pcVar1;
  iterator __position;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  uint h;
  uint local_50;
  int local_4c;
  int local_48;
  int local_44;
  long local_40;
  block32 *local_38;
  
  if (0 < blockcount && len != maxlen) {
    local_48 = len + 1;
    lVar5 = 0;
    local_4c = local_48 * 0x20;
    local_38 = key + len;
    local_40 = (ulong)(uint)blockcount << 5;
    local_44 = maxlen;
    do {
      pcVar1 = blocks->c + lVar5;
      uVar2 = *(undefined8 *)(pcVar1 + 8);
      uVar3 = *(undefined8 *)(pcVar1 + 0x10);
      uVar4 = *(undefined8 *)(pcVar1 + 0x18);
      *(undefined8 *)local_38->c = *(undefined8 *)pcVar1;
      *(undefined8 *)(local_38->c + 8) = uVar2;
      *(undefined8 *)(local_38->c + 0x10) = uVar3;
      *(undefined8 *)(local_38->c + 0x18) = uVar4;
      (*hash)(key,local_4c,0,&local_50);
      __position._M_current =
           (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)hashes,__position,&local_50)
        ;
      }
      else {
        *__position._M_current = local_50;
        (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      CombinationKeygenRecurse<unsigned_int,block32>
                (key,local_48,local_44,blocks,blockcount,hash,hashes);
      lVar5 = lVar5 + 0x20;
    } while (local_40 != lVar5);
  }
  return;
}

Assistant:

void CombinationKeygenRecurse ( blocktype * key, int len, int maxlen,
                  blocktype * blocks, int blockcount,
                  pfHash hash, std::vector<hashtype> & hashes )
{
  if(len == maxlen) return;  // end recursion

  for(int i = 0; i < blockcount; i++)
  {
    key[len] = blocks[i];

    //if(len == maxlen-1)
    {
      hashtype h;
      hash(key, (len+1) * sizeof(blocktype), 0, &h);
      hashes.push_back(h);
    }

    //else
    {
      CombinationKeygenRecurse(key,len+1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
}